

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O2

int EC_KEY_marshal_private_key(CBB *cbb,EC_KEY *key,uint enc_flags)

{
  int iVar1;
  uint uVar2;
  BIGNUM *bn;
  BIGNUM *in;
  int line;
  CBB ec_private_key;
  CBB child;
  CBB public_key;
  CBB private_key;
  
  if (((key == (EC_KEY *)0x0) || (key->group == (EC_GROUP *)0x0)) ||
     (key->priv_key == (EC_WRAPPED_SCALAR *)0x0)) {
    iVar1 = 0x43;
    line = 0x9c;
  }
  else {
    iVar1 = CBB_add_asn1(cbb,&ec_private_key,0x20000010);
    if (((iVar1 != 0) && (iVar1 = CBB_add_asn1_uint64(&ec_private_key,1), iVar1 != 0)) &&
       (iVar1 = CBB_add_asn1(&ec_private_key,&private_key,4), iVar1 != 0)) {
      bn = EC_GROUP_get0_order(key->group);
      uVar2 = BN_num_bytes(bn);
      in = EC_KEY_get0_private_key((EC_KEY *)key);
      iVar1 = BN_bn2cbb_padded(&private_key,(ulong)uVar2,(BIGNUM *)in);
      if (iVar1 != 0) {
        if (((enc_flags & 1) == 0) &&
           (((iVar1 = CBB_add_asn1(&ec_private_key,&child,0xa0000000), iVar1 == 0 ||
             (iVar1 = EC_KEY_marshal_curve_name(&child,key->group), iVar1 == 0)) ||
            (iVar1 = CBB_flush(&ec_private_key), iVar1 == 0)))) {
          iVar1 = 0x81;
          line = 0xb0;
        }
        else if ((((enc_flags & 2) == 0) && (key->pub_key != (EC_POINT *)0x0)) &&
                (((iVar1 = CBB_add_asn1(&ec_private_key,&child,0xa0000001), iVar1 == 0 ||
                  (((iVar1 = CBB_add_asn1(&child,&public_key,3), iVar1 == 0 ||
                    (iVar1 = CBB_add_u8(&public_key,'\0'), iVar1 == 0)) ||
                   (iVar1 = EC_POINT_point2cbb(&public_key,key->group,key->pub_key,key->conv_form,
                                               (BN_CTX *)0x0), iVar1 == 0)))) ||
                 (iVar1 = CBB_flush(&ec_private_key), iVar1 == 0)))) {
          iVar1 = 0x81;
          line = 0xc0;
        }
        else {
          iVar1 = CBB_flush(cbb);
          if (iVar1 != 0) {
            return 1;
          }
          iVar1 = 0x81;
          line = 0xc6;
        }
        goto LAB_003e882a;
      }
    }
    iVar1 = 0x81;
    line = 0xa7;
  }
LAB_003e882a:
  ERR_put_error(0xf,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                ,line);
  return 0;
}

Assistant:

int EC_KEY_marshal_private_key(CBB *cbb, const EC_KEY *key,
                               unsigned enc_flags) {
  if (key == NULL || key->group == NULL || key->priv_key == NULL) {
    OPENSSL_PUT_ERROR(EC, ERR_R_PASSED_NULL_PARAMETER);
    return 0;
  }

  CBB ec_private_key, private_key;
  if (!CBB_add_asn1(cbb, &ec_private_key, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_uint64(&ec_private_key, 1 /* version */) ||
      !CBB_add_asn1(&ec_private_key, &private_key, CBS_ASN1_OCTETSTRING) ||
      !BN_bn2cbb_padded(&private_key,
                        BN_num_bytes(EC_GROUP_get0_order(key->group)),
                        EC_KEY_get0_private_key(key))) {
    OPENSSL_PUT_ERROR(EC, EC_R_ENCODE_ERROR);
    return 0;
  }

  if (!(enc_flags & EC_PKEY_NO_PARAMETERS)) {
    CBB child;
    if (!CBB_add_asn1(&ec_private_key, &child, kParametersTag) ||
        !EC_KEY_marshal_curve_name(&child, key->group) ||
        !CBB_flush(&ec_private_key)) {
      OPENSSL_PUT_ERROR(EC, EC_R_ENCODE_ERROR);
      return 0;
    }
  }

  // TODO(fork): replace this flexibility with sensible default?
  if (!(enc_flags & EC_PKEY_NO_PUBKEY) && key->pub_key != NULL) {
    CBB child, public_key;
    if (!CBB_add_asn1(&ec_private_key, &child, kPublicKeyTag) ||
        !CBB_add_asn1(&child, &public_key, CBS_ASN1_BITSTRING) ||
        // As in a SubjectPublicKeyInfo, the byte-encoded public key is then
        // encoded as a BIT STRING with bits ordered as in the DER encoding.
        !CBB_add_u8(&public_key, 0 /* padding */) ||
        !EC_POINT_point2cbb(&public_key, key->group, key->pub_key,
                            key->conv_form, NULL) ||
        !CBB_flush(&ec_private_key)) {
      OPENSSL_PUT_ERROR(EC, EC_R_ENCODE_ERROR);
      return 0;
    }
  }

  if (!CBB_flush(cbb)) {
    OPENSSL_PUT_ERROR(EC, EC_R_ENCODE_ERROR);
    return 0;
  }

  return 1;
}